

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImParseFormatSanitizeForPrinting(char *fmt_in,char *fmt_out,size_t fmt_out_size)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  
  pbVar1 = (byte *)ImParseFormatFindEnd(fmt_in);
  if (pbVar1 + (1 - (long)fmt_in) < fmt_out_size) {
    while (pbVar2 = (byte *)fmt_in, pbVar2 < pbVar1) {
      uVar3 = *pbVar2 - 0x24;
      if ((0x3b < uVar3) ||
         (fmt_in = (char *)(pbVar2 + 1), (0x800000000000009U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
        *fmt_out = *pbVar2;
        fmt_out = (char *)((byte *)fmt_out + 1);
        fmt_in = (char *)(pbVar2 + 1);
      }
    }
    *fmt_out = 0;
    return;
  }
  __assert_fail("(size_t)(fmt_end - fmt_in + 1) < fmt_out_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                ,0xccb,"void ImParseFormatSanitizeForPrinting(const char *, char *, size_t)");
}

Assistant:

void ImParseFormatSanitizeForPrinting(const char* fmt_in, char* fmt_out, size_t fmt_out_size)
{
    const char* fmt_end = ImParseFormatFindEnd(fmt_in);
    IM_UNUSED(fmt_out_size);
    IM_ASSERT((size_t)(fmt_end - fmt_in + 1) < fmt_out_size); // Format is too long, let us know if this happens to you!
    while (fmt_in < fmt_end)
    {
        char c = *fmt_in++;
        if (c != '\'' && c != '$' && c != '_') // Custom flags provided by stb_sprintf.h. POSIX 2008 also supports '.
            *(fmt_out++) = c;
    }
    *fmt_out = 0; // Zero-terminate
}